

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey)

{
  allocator local_49;
  string local_48;
  SchnorrPubkey *local_28;
  SchnorrPubkey *internal_pubkey_local;
  TaprootScriptTree *tree_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  local_28 = internal_pubkey;
  internal_pubkey_local = (SchnorrPubkey *)tree;
  tree_local._0_4_ = witness_ver;
  tree_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_48,"",&local_49);
  Address(this,type,witness_ver,tree,internal_pubkey,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey)
    : Address(type, witness_ver, tree, internal_pubkey, "") {
  // do nothing
}